

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

string * test_sprintf<char>(string_view format,char *args)

{
  string *in_RDI;
  char *in_stack_00000020;
  basic_string_view<char> *in_stack_00000028;
  
  fmt::v5::sprintf<fmt::v5::basic_string_view<char>,char>(in_stack_00000028,in_stack_00000020);
  return in_RDI;
}

Assistant:

std::string test_sprintf(fmt::string_view format, const Args &... args) {
  return fmt::sprintf(format, args...);
}